

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::equivalent(path *p1,path *p2,error_code *ec)

{
  int iVar1;
  int iVar2;
  value_type *pvVar3;
  int *piVar4;
  error_code eVar5;
  bool local_16d;
  int local_16c;
  undefined4 uStack_164;
  int rc2;
  int e1;
  int rc1;
  stat s2;
  stat s1;
  error_code *ec_local;
  path *p2_local;
  path *p1_local;
  
  std::error_code::clear(ec);
  pvVar3 = path::c_str(p1);
  iVar1 = stat(pvVar3,(stat *)(s2.__glibc_reserved + 2));
  piVar4 = __errno_location();
  local_16c = *piVar4;
  pvVar3 = path::c_str(p2);
  iVar2 = stat(pvVar3,(stat *)&e1);
  if ((iVar1 == 0) && (iVar2 == 0)) {
    local_16d = false;
    if (((s2.__glibc_reserved[2] == _e1) && (local_16d = false, s1.st_dev == s2.st_dev)) &&
       (local_16d = false, s1.st_rdev == s2.st_rdev)) {
      local_16d = s1.st_atim.tv_nsec == s2.st_atim.tv_nsec;
    }
    p1_local._7_1_ = local_16d;
  }
  else {
    if (local_16c == 0) {
      piVar4 = __errno_location();
      local_16c = *piVar4;
    }
    eVar5 = detail::make_system_error(local_16c);
    *(ulong *)ec = CONCAT44(uStack_164,eVar5._M_value);
    ec->_M_cat = eVar5._M_cat;
    p1_local._7_1_ = false;
  }
  return p1_local._7_1_;
}

Assistant:

GHC_INLINE bool equivalent(const path& p1, const path& p2, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    std::shared_ptr<void> file1(::CreateFileW(p1.wstring().c_str(), 0, FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0), CloseHandle);
    auto e1 = ::GetLastError();
    std::shared_ptr<void> file2(::CreateFileW(p2.wstring().c_str(), 0, FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0), CloseHandle);
    if (file1.get() == INVALID_HANDLE_VALUE || file2.get() == INVALID_HANDLE_VALUE) {
#ifdef LWG_2937_BEHAVIOUR
        ec = detail::make_system_error(e1 ? e1 : ::GetLastError());
#else
        if (file1 == file2) {
            ec = detail::make_system_error(e1 ? e1 : ::GetLastError());
        }
#endif
        return false;
    }
    BY_HANDLE_FILE_INFORMATION inf1, inf2;
    if (!::GetFileInformationByHandle(file1.get(), &inf1)) {
        ec = detail::make_system_error();
        return false;
    }
    if (!::GetFileInformationByHandle(file2.get(), &inf2)) {
        ec = detail::make_system_error();
        return false;
    }
    return inf1.ftLastWriteTime.dwLowDateTime == inf2.ftLastWriteTime.dwLowDateTime && inf1.ftLastWriteTime.dwHighDateTime == inf2.ftLastWriteTime.dwHighDateTime && inf1.nFileIndexHigh == inf2.nFileIndexHigh && inf1.nFileIndexLow == inf2.nFileIndexLow &&
           inf1.nFileSizeHigh == inf2.nFileSizeHigh && inf1.nFileSizeLow == inf2.nFileSizeLow && inf1.dwVolumeSerialNumber == inf2.dwVolumeSerialNumber;
#else
    struct ::stat s1, s2;
    auto rc1 = ::stat(p1.c_str(), &s1);
    auto e1 = errno;
    auto rc2 = ::stat(p2.c_str(), &s2);
    if (rc1 || rc2) {
#ifdef LWG_2937_BEHAVIOUR
        ec = detail::make_system_error(e1 ? e1 : errno);
#else
        if (rc1 && rc2) {
            ec = detail::make_system_error(e1 ? e1 : errno);
        }
#endif
        return false;
    }
    return s1.st_dev == s2.st_dev && s1.st_ino == s2.st_ino && s1.st_size == s2.st_size && s1.st_mtime == s2.st_mtime;
#endif
}